

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O2

void __thiscall HEkkDualRow::deleteFreelist(HEkkDualRow *this,HighsInt iVar)

{
  size_type sVar1;
  HighsInt local_c;
  
  if ((this->freeList)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_c = iVar;
    sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&this->freeList,&local_c);
    if (sVar1 != 0) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (&(this->freeList)._M_t,&local_c);
    }
  }
  return;
}

Assistant:

void HEkkDualRow::deleteFreelist(HighsInt iVar) {
  if (!freeList.empty()) {
    if (freeList.count(iVar)) freeList.erase(iVar);
  }
}